

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

string * __thiscall
SchemeChar::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeChar *this)

{
  string local_70;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SchemeChar *local_18;
  SchemeChar *this_local;
  
  local_18 = this;
  this_local = (SchemeChar *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"#\\",&local_39);
  char_to_char_name_abi_cxx11_(&local_70,this->value);
  std::operator+(__return_storage_ptr__,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeChar::external_repr() const
{
    return std::string("#\\") + char_to_char_name(value);
}